

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

Id dxil_spv::build_physical_pointer_address_for_raw_load_store(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  Id IVar2;
  Value *pVVar3;
  mapped_type *pmVar4;
  Operation *this;
  Operation *this_00;
  Operation *offset_op;
  Operation *stride_op;
  Id local_38;
  Id byte_offset_id;
  Id element_offset;
  Id index_id;
  mapped_type *meta;
  Builder *pBStack_20;
  Id ptr_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  pBStack_20 = Converter::Impl::builder(impl);
  pCVar1 = instruction_local;
  pVVar3 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar3,0);
  pmVar4 = std::
           unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
           ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                         *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                            _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
  pCVar1 = instruction_local;
  pVVar3 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
  stride_op._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar3,0);
  pCVar1 = instruction_local;
  local_38 = 0;
  if (pmVar4->stride != 0) {
    pVVar3 = LLVMBC::Instruction::getOperand((Instruction *)builder,3);
    local_38 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar3,0);
  }
  pCVar1 = instruction_local;
  if (pmVar4->stride != 0) {
    IVar2 = spv::Builder::makeUintType(pBStack_20,0x20);
    this = Converter::Impl::allocate((Impl *)pCVar1,OpIMul,IVar2);
    Operation::add_id(this,stride_op._4_4_);
    IVar2 = spv::Builder::makeUintConstant(pBStack_20,pmVar4->stride,false);
    Operation::add_id(this,IVar2);
    Converter::Impl::add((Impl *)instruction_local,this,false);
    pCVar1 = instruction_local;
    IVar2 = spv::Builder::makeUintType(pBStack_20,0x20);
    this_00 = Converter::Impl::allocate((Impl *)pCVar1,OpIAdd,IVar2);
    Operation::add_id(this_00,this->id);
    Operation::add_id(this_00,local_38);
    Converter::Impl::add((Impl *)instruction_local,this_00,false);
    stride_op._4_4_ = this_00->id;
  }
  IVar2 = emit_u32x2_u32_add((Impl *)instruction_local,meta._4_4_,stride_op._4_4_);
  return IVar2;
}

Assistant:

static spv::Id build_physical_pointer_address_for_raw_load_store(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[ptr_id];

	spv::Id index_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id element_offset = 0;
	if (meta.stride != 0)
		element_offset = impl.get_id_for_value(instruction->getOperand(3));

	spv::Id byte_offset_id = 0;
	if (meta.stride)
	{
		auto *stride_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		stride_op->add_id(index_id);
		stride_op->add_id(builder.makeUintConstant(meta.stride));
		impl.add(stride_op);

		auto *offset_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
		offset_op->add_id(stride_op->id);
		offset_op->add_id(element_offset);
		impl.add(offset_op);

		byte_offset_id = offset_op->id;
	}
	else
	{
		byte_offset_id = index_id;
	}

	return emit_u32x2_u32_add(impl, ptr_id, byte_offset_id);
}